

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

int Sdb_StoPrepareSet(Sdb_Sto_t *p,int iObj,int Index)

{
  uint uVar1;
  int *piVar2;
  Sdb_Cut_t *pSVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((iObj < 0) || (p->vCuts->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  piVar2 = p->vCuts->pArray[(uint)iObj].pArray;
  iVar9 = *piVar2;
  if (0 < iVar9) {
    piVar7 = piVar2 + 1;
    piVar4 = p->pCuts[(uint)Index][0].pLeaves;
    lVar8 = 0;
    do {
      *(uint *)&p->pCuts[(uint)Index][lVar8].field_0x14 =
           *(uint *)&p->pCuts[(uint)Index][lVar8].field_0x14 & 0xfffffff | *piVar7 << 0x1c;
      iVar9 = *piVar7;
      if (0 < iVar9) {
        lVar5 = 0;
        do {
          piVar4[lVar5] = piVar7[lVar5 + 1];
          iVar9 = *piVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar9);
      }
      pSVar3 = p->pCuts[(uint)Index] + lVar8;
      pSVar3->iFunc = piVar7[(long)iVar9 + 1];
      uVar1 = *(uint *)&pSVar3->field_0x14;
      if (uVar1 < 0x10000000) {
        pSVar3->Sign = 0;
        uVar6 = 0;
      }
      else {
        uVar11 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 | 1L << ((ulong)(byte)piVar4[uVar11] & 0x3f);
          uVar11 = uVar11 + 1;
        } while (uVar1 >> 0x1c != uVar11);
        uVar6 = 0;
        pSVar3->Sign = uVar10;
        if (0xfffffff < uVar1) {
          uVar10 = 0;
          uVar6 = 0;
          do {
            iVar9 = piVar4[uVar10];
            if (((long)iVar9 < 0) || (p->vRefs->nSize <= iVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar6 = uVar6 + (p->vRefs->pArray[iVar9] == 1);
            uVar10 = uVar10 + 1;
          } while (uVar1 >> 0x1c != uVar10);
          uVar6 = uVar6 & 0xfffffff;
        }
      }
      *(uint *)&pSVar3->field_0x14 = uVar1 & 0xf0000000 | uVar6;
      lVar8 = lVar8 + 1;
      piVar7 = piVar7 + (long)*piVar7 + 2;
      iVar9 = *piVar2;
      piVar4 = piVar4 + 0xc;
    } while (lVar8 < iVar9);
  }
  return iVar9;
}

Assistant:

static inline int Sdb_StoPrepareSet( Sdb_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sdb_ForEachCut( pList, pCut, i )
    {
        Sdb_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sdb_CutGetSign( pCutTemp );
        pCutTemp->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutTemp );
    }
    return pList[0];
}